

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O3

UBool utf8TextAccess(UText *ut,int64_t index,UBool forward)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  int iVar8;
  uint8_t *puVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  char cVar16;
  uint *puVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  int32_t srcIx;
  uint local_90;
  uint local_8c;
  undefined8 local_88;
  uint8_t *local_80;
  UText *local_78;
  UChar *local_70;
  undefined8 local_68;
  ulong local_60;
  uint local_54;
  uint *local_50;
  long local_48;
  void *local_40;
  uint *local_38;
  
  local_80 = (uint8_t *)ut->context;
  uVar3 = ut->b;
  uVar7 = (ulong)uVar3;
  uVar15 = 0x7fffffff;
  if ((ulong)index < 0x7fffffff) {
    uVar15 = index;
  }
  uVar15 = uVar15 & 0xffffffff;
  if (index < 0) {
    uVar15 = 0;
  }
  uVar2 = (uint)uVar15;
  if ((int)uVar3 < (int)uVar2) {
    if ((int)uVar3 < 0) {
      uVar3 = ut->c;
      uVar4 = (ulong)uVar3;
      if ((int)uVar3 <= (int)uVar2) {
        uVar5 = uVar4;
        if ((int)uVar3 < (int)uVar2) {
          puVar9 = local_80 + (int)uVar3;
          do {
            uVar5 = uVar4;
            if (*puVar9 == '\0') break;
            uVar3 = (int)uVar4 + 1;
            uVar4 = (ulong)uVar3;
            ut->c = uVar3;
            puVar9 = puVar9 + 1;
            uVar5 = uVar15;
          } while (uVar2 != uVar3);
        }
        if (local_80[(int)uVar5] == '\0') {
          ut->b = (int)uVar5;
          *(byte *)&ut->providerProperties = (byte)ut->providerProperties & 0xfd;
          uVar15 = uVar5;
          uVar7 = uVar5;
        }
      }
    }
    else {
      uVar15 = (ulong)uVar3;
    }
  }
  uVar3 = (uint)uVar15;
  local_48 = (long)(int)uVar3;
  local_8c = (uint)uVar7;
  local_78 = ut;
  if (forward == '\0') {
    if (ut->chunkNativeStart == local_48) {
      if (uVar3 == 0) goto LAB_0018e3bd;
      puVar17 = (uint *)ut->q;
      uVar2 = *puVar17;
      if (((int)uVar2 < (int)uVar3) && (uVar11 = puVar17[1], (int)uVar3 <= (int)uVar11))
      goto LAB_0018df3a;
    }
    else {
      puVar17 = (uint *)ut->q;
      uVar2 = *puVar17;
    }
    if (((int)uVar2 < (int)uVar3) && (uVar11 = puVar17[1], (int)uVar3 <= (int)uVar11))
    goto LAB_0018df3a;
    if (uVar3 != 0) {
      if ((ut->chunkNativeStart < local_48) && (local_48 <= ut->chunkNativeLimit)) {
        pvVar6 = ut->p;
        iVar8 = (uint)*(byte *)((long)pvVar6 +
                               ((long)(int)uVar3 - (long)*(int *)((long)pvVar6 + 0x14)) + 0x84) -
                *(int *)((long)pvVar6 + 8);
        ut->chunkOffset = iVar8;
        return iVar8 != 0;
      }
      if ((uVar3 != local_8c) && ((char)local_80[local_48] < -0x40)) {
        uVar3 = utf8_back1SafeBody_63(local_80,0,uVar3);
        uVar15 = (ulong)uVar3;
        puVar17 = (uint *)ut->q;
      }
      ut->q = ut->p;
      ut->p = puVar17;
      local_88 = puVar17 + 6;
      local_90 = (uint)uVar15;
      uVar11 = local_90 - 0x65;
      *(undefined1 *)((long)puVar17 + 0x82) = 0x65;
      *(undefined1 *)((long)puVar17 + 0xe9) = 0x22;
      uVar2 = 0x22;
      uVar3 = 0x22;
      puVar9 = local_80;
      local_60 = uVar15;
      do {
        uVar13 = (uint)uVar15;
        if (((int)local_90 < 1) || ((int)(local_90 - uVar11) < 6)) break;
        uVar13 = local_90 - 1;
        uVar18 = uVar3 - 1;
        bVar10 = puVar9[uVar13];
        cVar16 = (char)uVar11;
        local_90 = uVar13;
        if ((char)bVar10 < '\0') {
          uVar2 = utf8_prevCharSafeBody_63(puVar9,0,(int32_t *)&local_90,(uint)bVar10,-3);
          if (0xffff < (int)uVar2) {
            *(ushort *)((long)puVar17 + (ulong)uVar18 * 2 + 0x18) = (ushort)uVar2 & 0x3ff | 0xdc00;
            *(char *)((long)puVar17 + (ulong)uVar18 + 0x60) = (char)local_90 - cVar16;
            uVar2 = (uVar2 >> 10) - 0x2840;
            uVar18 = uVar3 - 2;
          }
          *(short *)((long)puVar17 + (ulong)uVar18 * 2 + 0x18) = (short)uVar2;
          *(char *)((long)puVar17 + (ulong)uVar18 + 0x60) = (char)local_90 - cVar16;
          uVar7 = (ulong)uVar13;
          do {
            *(char *)((long)puVar17 + uVar7 + (0x84 - (long)(int)uVar11)) = (char)uVar18;
            bVar20 = (long)(int)local_90 < (long)uVar7;
            uVar7 = uVar7 - 1;
            puVar9 = local_80;
            uVar15 = local_60;
            uVar3 = uVar18;
            uVar2 = uVar18;
          } while (bVar20);
        }
        else {
          *(short *)((long)puVar17 + (ulong)uVar18 * 2 + 0x18) = (short)(char)bVar10;
          *(char *)((long)puVar17 + (long)(int)(uVar13 - uVar11) + 0x84) = (char)uVar18;
          *(char *)((long)puVar17 + (ulong)uVar18 + 0x60) = (char)uVar13 - cVar16;
          uVar3 = uVar18;
        }
        uVar13 = (uint)uVar15;
      } while (2 < (int)uVar3);
      *puVar17 = local_90;
      puVar17[1] = uVar13;
      puVar17[2] = uVar3;
      puVar17[3] = 0x22;
      puVar17[4] = uVar2 - uVar3;
      puVar17[5] = uVar11;
      local_78->chunkContents = (UChar *)((long)local_88 + (long)(int)uVar3 * 2);
      local_78->chunkLength = 0x22 - uVar3;
      local_78->chunkOffset = 0x22 - uVar3;
      local_78->chunkNativeStart = (long)(int)local_90;
      local_78->chunkNativeLimit = (long)(int)uVar13;
      local_78->nativeIndexingLimit = uVar2 - uVar3;
      return '\x01';
    }
    if (uVar2 == 0) {
      uVar2 = 0;
    }
    else {
LAB_0018e2cf:
      *puVar17 = uVar3;
      puVar17[1] = uVar3;
      puVar17[2] = 0;
      puVar17[3] = 0;
      puVar17[4] = 0;
      puVar17[5] = uVar3;
      *(undefined1 *)(puVar17 + 0x18) = 0;
      *(undefined1 *)(puVar17 + 0x21) = 0;
      puVar17 = (uint *)ut->q;
      uVar2 = *puVar17;
    }
  }
  else {
    lVar14 = ut->chunkNativeLimit;
    if (lVar14 == local_48) {
      if (uVar3 == local_8c) goto LAB_0018dd3b;
      puVar17 = (uint *)ut->q;
      uVar2 = *puVar17;
      if (((int)uVar2 <= (int)uVar3) && (uVar11 = puVar17[1], (int)uVar3 < (int)uVar11))
      goto LAB_0018df3a;
    }
    else {
      puVar17 = (uint *)ut->q;
      uVar2 = *puVar17;
    }
    if (((int)uVar2 <= (int)uVar3) && (uVar11 = puVar17[1], (int)uVar3 < (int)uVar11)) {
LAB_0018df3a:
      ut->q = ut->p;
      ut->p = puVar17;
      uVar13 = puVar17[2];
      ut->chunkContents = (UChar *)((long)puVar17 + (long)(int)uVar13 * 2 + 0x18);
      ut->chunkLength = puVar17[3] - uVar13;
      ut->chunkNativeStart = (long)(int)uVar2;
      ut->chunkNativeLimit = (long)(int)uVar11;
      ut->nativeIndexingLimit = puVar17[4];
      ut->chunkOffset =
           *(byte *)((long)puVar17 + ((long)(int)uVar3 - (long)(int)puVar17[5]) + 0x84) - uVar13;
      return '\x01';
    }
    if (uVar3 != local_8c) {
      if ((local_48 < lVar14) && (ut->chunkNativeStart <= local_48)) {
        pvVar6 = ut->p;
        ut->chunkOffset =
             (uint)*(byte *)((long)pvVar6 +
                            ((long)(int)uVar3 - (long)*(int *)((long)pvVar6 + 0x14)) + 0x84) -
             *(int *)((long)pvVar6 + 8);
        return '\x01';
      }
      if ((char)local_80[local_48] < -0x40) {
        uVar3 = utf8_back1SafeBody_63(local_80,0,uVar3);
        uVar15 = (ulong)uVar3;
        puVar17 = (uint *)ut->q;
        local_8c = ut->b;
        local_48 = (long)(int)uVar3;
      }
      ut->q = ut->p;
      ut->p = puVar17;
      uVar3 = 0x7fffffff;
      if (local_8c < 0x7fffffff) {
        uVar3 = local_8c;
      }
      local_70 = (UChar *)(puVar17 + 6);
      local_38 = puVar17 + 0x18;
      pvVar6 = (void *)((long)puVar17 + (0x84 - local_48));
      local_68 = 0;
      puVar9 = local_80;
      uVar7 = uVar15;
      uVar2 = 0;
      local_54 = uVar3;
      local_50 = puVar17;
      local_40 = pvVar6;
      do {
        uVar18 = (uint)uVar7;
        lVar14 = (long)(int)uVar18;
        uVar1 = puVar9[lVar14];
        uVar11 = (uint)(char)uVar1;
        uVar13 = (uint)uVar15;
        if ((char)uVar1 < '\x01') {
          if ((char)local_68 == '\0') {
            puVar17[4] = uVar2;
            uVar11 = (uint)puVar9[lVar14];
            local_68 = CONCAT71((int7)((ulong)pvVar6 >> 8),1);
          }
          uVar19 = uVar18 + 1;
          bVar10 = (byte)uVar11;
          uVar12 = uVar11 & 0xff;
          local_60 = CONCAT44(local_60._4_4_,uVar19);
          if ((char)bVar10 < '\0') {
            uVar7 = 0xfffd;
            if (uVar19 == uVar3) {
LAB_0018e0ce:
              uVar4 = (ulong)uVar3;
            }
            else {
              if (bVar10 < 0xe0) {
                if (0xc1 < bVar10) {
                  uVar11 = uVar11 & 0x1f;
LAB_0018e16b:
                  uVar4 = (ulong)uVar19;
                  if ((byte)(puVar9[(int)uVar19] ^ 0x80) < 0x40) {
                    uVar12 = uVar11 << 6 | puVar9[(int)uVar19] ^ 0x80;
                    uVar19 = uVar19 + 1;
                    goto LAB_0018e0a6;
                  }
                  goto LAB_0018e1df;
                }
              }
              else if (bVar10 < 0xf0) {
                uVar11 = uVar11 & 0xf;
                if (((byte)" 000000000000\x1000"[uVar11] >> (puVar9[(int)uVar19] >> 5) & 1) != 0) {
                  bVar10 = puVar9[(int)uVar19] & 0x3f;
                  uVar4 = (ulong)uVar19;
LAB_0018e148:
                  uVar19 = (int)uVar4 + 1;
                  if (uVar19 != uVar3) {
                    uVar11 = (uint)bVar10 | uVar11 << 6;
                    goto LAB_0018e16b;
                  }
                  goto LAB_0018e0ce;
                }
              }
              else if (bVar10 < 0xf5) {
                if (((uint)(int)""[puVar9[(int)uVar19] >> 4] >> (uVar12 - 0xf0 & 0x1f) & 1) != 0) {
                  uVar4 = lVar14 + 2;
                  if ((uint)uVar4 == uVar3) goto LAB_0018e0ce;
                  bVar10 = puVar9[uVar4] + 0x80;
                  if (bVar10 < 0x40) {
                    uVar11 = puVar9[(int)uVar19] & 0x3f | (uVar12 - 0xf0) * 0x40;
                    goto LAB_0018e148;
                  }
                  goto LAB_0018e1df;
                }
              }
              uVar4 = (ulong)uVar19;
            }
LAB_0018e1df:
            uVar19 = (uint)uVar4;
            uVar11 = uVar2 + 1;
            local_70[(int)uVar2] = (UChar)uVar7;
            local_88 = (uint *)CONCAT44(local_88._4_4_,
                                        (int)CONCAT71((int7)(uVar7 >> 8),(int)uVar7 == 0));
          }
          else {
LAB_0018e0a6:
            uVar4 = (ulong)uVar19;
            if (((int)local_8c < 0) && (uVar12 == 0)) {
              uVar19 = uVar19 - 1;
              cVar16 = '\x01';
              bVar20 = false;
              goto LAB_0018e27a;
            }
            if (uVar12 < 0x10000) {
              uVar7 = (ulong)uVar12;
              goto LAB_0018e1df;
            }
            local_70[(int)uVar2] = (short)(uVar12 >> 10) + L'ퟀ';
            uVar11 = uVar2 + 2;
            local_70[(long)(int)uVar2 + 1] = (ushort)uVar12 & 0x3ff | 0xdc00;
            local_88 = (uint *)((ulong)local_88._4_4_ << 0x20);
          }
          uVar3 = uVar2 + 1;
          if ((int)(uVar2 + 1) < (int)uVar11) {
            uVar3 = uVar11;
          }
          memset((void *)((long)(int)uVar2 + (long)local_38),uVar18 - uVar13,
                 (ulong)(~uVar2 + uVar3) + 1);
          uVar3 = (uint)local_60;
          if ((int)(uint)local_60 < (int)uVar19) {
            uVar3 = uVar19;
          }
          pvVar6 = memset((void *)(lVar14 + (long)local_40),uVar2,(ulong)(~uVar18 + uVar3) + 1);
          cVar16 = (char)local_88;
          puVar9 = local_80;
          puVar17 = local_50;
          uVar3 = local_54;
        }
        else {
          *(short *)((long)puVar17 + (long)(int)uVar2 * 2 + 0x18) = (short)(char)uVar1;
          *(char *)((long)puVar17 + (long)(int)uVar2 + 0x60) = (char)(uVar18 - uVar13);
          pvVar6 = (void *)(long)(int)(uVar18 - uVar13);
          *(char *)((long)(puVar17 + 0x21) + (long)pvVar6) = (char)uVar2;
          uVar19 = uVar18 + 1;
          uVar11 = uVar2 + 1;
          cVar16 = '\0';
        }
        uVar7 = (ulong)uVar19;
        uVar2 = uVar11;
      } while (((int)uVar19 < (int)uVar3) && ((int)uVar11 < 0x20));
      bVar20 = (char)local_68 == '\0';
      local_50 = puVar17;
LAB_0018e27a:
      *(char *)((long)local_50 + (long)(int)uVar2 + 0x60) = (char)(uVar19 - uVar13);
      *(char *)((long)local_50 + (long)(int)(uVar19 - uVar13) + 0x84) = (char)uVar2;
      *local_50 = uVar13;
      local_50[1] = uVar19;
      local_50[2] = 0;
      local_50[3] = uVar2;
      if (bVar20) {
        local_50[4] = uVar2;
        uVar3 = uVar2;
      }
      else {
        uVar3 = local_50[4];
      }
      local_50[5] = uVar13;
      local_78->chunkContents = local_70;
      local_78->chunkOffset = 0;
      local_78->chunkLength = uVar2;
      local_78->chunkNativeStart = local_48;
      local_78->chunkNativeLimit = (long)(int)uVar19;
      local_78->nativeIndexingLimit = uVar3;
      if (-1 < (int)local_8c) {
        return '\x01';
      }
      if ((int)uVar19 <= local_78->c) {
        return '\x01';
      }
      local_78->c = uVar19;
      if (cVar16 != '\0') {
        local_78->b = uVar19;
        *(byte *)&local_78->providerProperties = (byte)local_78->providerProperties & 0xfd;
        return '\x01';
      }
      return '\x01';
    }
    if (lVar14 == local_48) {
LAB_0018dd3b:
      ut->chunkOffset = ut->chunkLength;
      return '\0';
    }
    if (uVar3 != puVar17[1]) goto LAB_0018e2cf;
  }
  ut->q = ut->p;
  ut->p = puVar17;
  uVar11 = puVar17[2];
  ut->chunkContents = (UChar *)((long)puVar17 + (long)(int)uVar11 * 2 + 0x18);
  iVar8 = puVar17[3] - uVar11;
  ut->chunkLength = iVar8;
  ut->chunkNativeStart = (long)(int)uVar2;
  uVar2 = puVar17[1];
  ut->chunkNativeLimit = (long)(int)uVar2;
  ut->nativeIndexingLimit = puVar17[4];
  if (uVar3 == uVar2) {
    ut->chunkOffset = iVar8;
    return '\0';
  }
LAB_0018e3bd:
  ut->chunkOffset = 0;
  return '\0';
}

Assistant:

static UBool U_CALLCONV
utf8TextAccess(UText *ut, int64_t index, UBool forward) {
    //
    //  Apologies to those who are allergic to goto statements.
    //    Consider each goto to a labelled block to be the equivalent of
    //         call the named block as if it were a function();
    //         return;
    //
    const uint8_t *s8=(const uint8_t *)ut->context;
    UTF8Buf *u8b = NULL;
    int32_t  length = ut->b;         // Length of original utf-8
    int32_t  ix= (int32_t)index;     // Requested index, trimmed to 32 bits.
    int32_t  mapIndex = 0;
    if (index<0) {
        ix=0;
    } else if (index > 0x7fffffff) {
        // Strings with 64 bit lengths not supported by this UTF-8 provider.
        ix = 0x7fffffff;
    }

    // Pin requested index to the string length.
    if (ix>length) {
        if (length>=0) {
            ix=length;
        } else if (ix>=ut->c) {
            // Zero terminated string, and requested index is beyond
            //   the region that has already been scanned.
            //   Scan up to either the end of the string or to the
            //   requested position, whichever comes first.
            while (ut->c<ix && s8[ut->c]!=0) {
                ut->c++;
            }
            //  TODO:  support for null terminated string length > 32 bits.
            if (s8[ut->c] == 0) {
                // We just found the actual length of the string.
                //  Trim the requested index back to that.
                ix     = ut->c;
                ut->b  = ut->c;
                length = ut->c;
                ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
            }
        }
    }

    //
    // Dispatch to the appropriate action for a forward iteration request.
    //
    if (forward) {
        if (ix==ut->chunkNativeLimit) {
            // Check for normal sequential iteration cases first.
            if (ix==length) {
                // Just reached end of string
                // Don't swap buffers, but do set the
                //   current buffer position.
                ut->chunkOffset = ut->chunkLength;
                return FALSE;
            } else {
                // End of current buffer.
                //   check whether other buffer already has what we need.
                UTF8Buf *altB = (UTF8Buf *)ut->q;
                if (ix>=altB->bufNativeStart && ix<altB->bufNativeLimit) {
                    goto swapBuffers;
                }
            }
        }

        // A random access.  Desired index could be in either or niether buf.
        // For optimizing the order of testing, first check for the index
        //    being in the other buffer.  This will be the case for uses that
        //    move back and forth over a fairly limited range
        {
            u8b = (UTF8Buf *)ut->q;   // the alternate buffer
            if (ix>=u8b->bufNativeStart && ix<u8b->bufNativeLimit) {
                // Requested index is in the other buffer.
                goto swapBuffers;
            }
            if (ix == length) {
                // Requested index is end-of-string.
                //   (this is the case of randomly seeking to the end.
                //    The case of iterating off the end is handled earlier.)
                if (ix == ut->chunkNativeLimit) {
                    // Current buffer extends up to the end of the string.
                    //   Leave it as the current buffer.
                    ut->chunkOffset = ut->chunkLength;
                    return FALSE;
                }
                if (ix == u8b->bufNativeLimit) {
                    // Alternate buffer extends to the end of string.
                    //   Swap it in as the current buffer.
                    goto swapBuffersAndFail;
                }

                // Neither existing buffer extends to the end of the string.
                goto makeStubBuffer;
            }

            if (ix<ut->chunkNativeStart || ix>=ut->chunkNativeLimit) {
                // Requested index is in neither buffer.
                goto fillForward;
            }

            // Requested index is in this buffer.
            u8b = (UTF8Buf *)ut->p;   // the current buffer
            mapIndex = ix - u8b->toUCharsMapStart;
            U_ASSERT(mapIndex < (int32_t)sizeof(UTF8Buf::mapToUChars));
            ut->chunkOffset = u8b->mapToUChars[mapIndex] - u8b->bufStartIdx;
            return TRUE;

        }
    }


    //
    // Dispatch to the appropriate action for a
    //   Backwards Diretion iteration request.
    //
    if (ix==ut->chunkNativeStart) {
        // Check for normal sequential iteration cases first.
        if (ix==0) {
            // Just reached the start of string
            // Don't swap buffers, but do set the
            //   current buffer position.
            ut->chunkOffset = 0;
            return FALSE;
        } else {
            // Start of current buffer.
            //   check whether other buffer already has what we need.
            UTF8Buf *altB = (UTF8Buf *)ut->q;
            if (ix>altB->bufNativeStart && ix<=altB->bufNativeLimit) {
                goto swapBuffers;
            }
        }
    }

    // A random access.  Desired index could be in either or niether buf.
    // For optimizing the order of testing,
    //    Most likely case:  in the other buffer.
    //    Second most likely: in neither buffer.
    //    Unlikely, but must work:  in the current buffer.
    u8b = (UTF8Buf *)ut->q;   // the alternate buffer
    if (ix>u8b->bufNativeStart && ix<=u8b->bufNativeLimit) {
        // Requested index is in the other buffer.
        goto swapBuffers;
    }
    // Requested index is start-of-string.
    //   (this is the case of randomly seeking to the start.
    //    The case of iterating off the start is handled earlier.)
    if (ix==0) {
        if (u8b->bufNativeStart==0) {
            // Alternate buffer contains the data for the start string.
            // Make it be the current buffer.
            goto swapBuffersAndFail;
        } else {
            // Request for data before the start of string,
            //   neither buffer is usable.
            //   set up a zero-length buffer.
            goto makeStubBuffer;
        }
    }

    if (ix<=ut->chunkNativeStart || ix>ut->chunkNativeLimit) {
        // Requested index is in neither buffer.
        goto fillReverse;
    }

    // Requested index is in this buffer.
    //   Set the utf16 buffer index.
    u8b = (UTF8Buf *)ut->p;
    mapIndex = ix - u8b->toUCharsMapStart;
    ut->chunkOffset = u8b->mapToUChars[mapIndex] - u8b->bufStartIdx;
    if (ut->chunkOffset==0) {
        // This occurs when the first character in the text is
        //   a multi-byte UTF-8 char, and the requested index is to
        //   one of the trailing bytes.  Because there is no preceding ,
        //   character, this access fails.  We can't pick up on the
        //   situation sooner because the requested index is not zero.
        return FALSE;
    } else {
        return TRUE;
    }



swapBuffers:
    //  The alternate buffer (ut->q) has the string data that was requested.
    //  Swap the primary and alternate buffers, and set the
    //   chunk index into the new primary buffer.
    {
        u8b   = (UTF8Buf *)ut->q;
        ut->q = ut->p;
        ut->p = u8b;
        ut->chunkContents       = &u8b->buf[u8b->bufStartIdx];
        ut->chunkLength         = u8b->bufLimitIdx - u8b->bufStartIdx;
        ut->chunkNativeStart    = u8b->bufNativeStart;
        ut->chunkNativeLimit    = u8b->bufNativeLimit;
        ut->nativeIndexingLimit = u8b->bufNILimit;

        // Index into the (now current) chunk
        // Use the map to set the chunk index.  It's more trouble than it's worth
        //    to check whether native indexing can be used.
        U_ASSERT(ix>=u8b->bufNativeStart);
        U_ASSERT(ix<=u8b->bufNativeLimit);
        mapIndex = ix - u8b->toUCharsMapStart;
        U_ASSERT(mapIndex>=0);
        U_ASSERT(mapIndex<(int32_t)sizeof(u8b->mapToUChars));
        ut->chunkOffset = u8b->mapToUChars[mapIndex] - u8b->bufStartIdx;

        return TRUE;
    }


 swapBuffersAndFail:
    // We got a request for either the start or end of the string,
    //  with iteration continuing in the out-of-bounds direction.
    // The alternate buffer already contains the data up to the
    //  start/end.
    // Swap the buffers, then return failure, indicating that we couldn't
    //  make things correct for continuing the iteration in the requested
    //  direction.  The position & buffer are correct should the
    //  user decide to iterate in the opposite direction.
    u8b   = (UTF8Buf *)ut->q;
    ut->q = ut->p;
    ut->p = u8b;
    ut->chunkContents       = &u8b->buf[u8b->bufStartIdx];
    ut->chunkLength         = u8b->bufLimitIdx - u8b->bufStartIdx;
    ut->chunkNativeStart    = u8b->bufNativeStart;
    ut->chunkNativeLimit    = u8b->bufNativeLimit;
    ut->nativeIndexingLimit = u8b->bufNILimit;

    // Index into the (now current) chunk
    //  For this function  (swapBuffersAndFail), the requested index
    //    will always be at either the start or end of the chunk.
    if (ix==u8b->bufNativeLimit) {
        ut->chunkOffset = ut->chunkLength;
    } else  {
        ut->chunkOffset = 0;
        U_ASSERT(ix == u8b->bufNativeStart);
    }
    return FALSE;

makeStubBuffer:
    //   The user has done a seek/access past the start or end
    //   of the string.  Rather than loading data that is likely
    //   to never be used, just set up a zero-length buffer at
    //   the position.
    u8b = (UTF8Buf *)ut->q;
    u8b->bufNativeStart   = ix;
    u8b->bufNativeLimit   = ix;
    u8b->bufStartIdx      = 0;
    u8b->bufLimitIdx      = 0;
    u8b->bufNILimit       = 0;
    u8b->toUCharsMapStart = ix;
    u8b->mapToNative[0]   = 0;
    u8b->mapToUChars[0]   = 0;
    goto swapBuffersAndFail;



fillForward:
    {
        // Move the incoming index to a code point boundary.
        U8_SET_CP_START(s8, 0, ix);

        // Swap the UText buffers.
        //  We want to fill what was previously the alternate buffer,
        //  and make what was the current buffer be the new alternate.
        UTF8Buf *u8b_swap = (UTF8Buf *)ut->q;
        ut->q = ut->p;
        ut->p = u8b_swap;

        int32_t strLen = ut->b;
        UBool   nulTerminated = FALSE;
        if (strLen < 0) {
            strLen = 0x7fffffff;
            nulTerminated = TRUE;
        }

        UChar   *buf = u8b_swap->buf;
        uint8_t *mapToNative  = u8b_swap->mapToNative;
        uint8_t *mapToUChars  = u8b_swap->mapToUChars;
        int32_t  destIx       = 0;
        int32_t  srcIx        = ix;
        UBool    seenNonAscii = FALSE;
        UChar32  c = 0;

        // Fill the chunk buffer and mapping arrays.
        while (destIx<UTF8_TEXT_CHUNK_SIZE) {
            c = s8[srcIx];
            if (c>0 && c<0x80) {
                // Special case ASCII range for speed.
                //   zero is excluded to simplify bounds checking.
                buf[destIx] = (UChar)c;
                mapToNative[destIx]    = (uint8_t)(srcIx - ix);
                mapToUChars[srcIx-ix]  = (uint8_t)destIx;
                srcIx++;
                destIx++;
            } else {
                // General case, handle everything.
                if (seenNonAscii == FALSE) {
                    seenNonAscii = TRUE;
                    u8b_swap->bufNILimit = destIx;
                }

                int32_t  cIx      = srcIx;
                int32_t  dIx      = destIx;
                int32_t  dIxSaved = destIx;
                U8_NEXT_OR_FFFD(s8, srcIx, strLen, c);
                if (c==0 && nulTerminated) {
                    srcIx--;
                    break;
                }

                U16_APPEND_UNSAFE(buf, destIx, c);
                do {
                    mapToNative[dIx++] = (uint8_t)(cIx - ix);
                } while (dIx < destIx);

                do {
                    mapToUChars[cIx++ - ix] = (uint8_t)dIxSaved;
                } while (cIx < srcIx);
            }
            if (srcIx>=strLen) {
                break;
            }

        }

        //  store Native <--> Chunk Map entries for the end of the buffer.
        //    There is no actual character here, but the index position is valid.
        mapToNative[destIx]     = (uint8_t)(srcIx - ix);
        mapToUChars[srcIx - ix] = (uint8_t)destIx;

        //  fill in Buffer descriptor
        u8b_swap->bufNativeStart     = ix;
        u8b_swap->bufNativeLimit     = srcIx;
        u8b_swap->bufStartIdx        = 0;
        u8b_swap->bufLimitIdx        = destIx;
        if (seenNonAscii == FALSE) {
            u8b_swap->bufNILimit     = destIx;
        }
        u8b_swap->toUCharsMapStart   = u8b_swap->bufNativeStart;

        // Set UText chunk to refer to this buffer.
        ut->chunkContents       = buf;
        ut->chunkOffset         = 0;
        ut->chunkLength         = u8b_swap->bufLimitIdx;
        ut->chunkNativeStart    = u8b_swap->bufNativeStart;
        ut->chunkNativeLimit    = u8b_swap->bufNativeLimit;
        ut->nativeIndexingLimit = u8b_swap->bufNILimit;

        // For zero terminated strings, keep track of the maximum point
        //   scanned so far.
        if (nulTerminated && srcIx>ut->c) {
            ut->c = srcIx;
            if (c==0) {
                // We scanned to the end.
                //   Remember the actual length.
                ut->b = srcIx;
                ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
            }
        }
        return TRUE;
    }


fillReverse:
    {
        // Move the incoming index to a code point boundary.
        // Can only do this if the incoming index is somewhere in the interior of the string.
        //   If index is at the end, there is no character there to look at.
        if (ix != ut->b) {
            // Note: this function will only move the index back if it is on a trail byte
            //       and there is a preceding lead byte and the sequence from the lead 
            //       through this trail could be part of a valid UTF-8 sequence
            //       Otherwise the index remains unchanged.
            U8_SET_CP_START(s8, 0, ix);
        }

        // Swap the UText buffers.
        //  We want to fill what was previously the alternate buffer,
        //  and make what was the current buffer be the new alternate.
        UTF8Buf *u8b_swap = (UTF8Buf *)ut->q;
        ut->q = ut->p;
        ut->p = u8b_swap;

        UChar   *buf = u8b_swap->buf;
        uint8_t *mapToNative = u8b_swap->mapToNative;
        uint8_t *mapToUChars = u8b_swap->mapToUChars;
        int32_t  toUCharsMapStart = ix - sizeof(UTF8Buf::mapToUChars) + 1;
        // Note that toUCharsMapStart can be negative. Happens when the remaining
        // text from current position to the beginning is less than the buffer size.
        // + 1 because mapToUChars must have a slot at the end for the bufNativeLimit entry.
        int32_t  destIx = UTF8_TEXT_CHUNK_SIZE+2;   // Start in the overflow region
                                                    //   at end of buffer to leave room
                                                    //   for a surrogate pair at the
                                                    //   buffer start.
        int32_t  srcIx  = ix;
        int32_t  bufNILimit = destIx;
        UChar32   c;

        // Map to/from Native Indexes, fill in for the position at the end of
        //   the buffer.
        //
        mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
        mapToUChars[srcIx - toUCharsMapStart] = (uint8_t)destIx;

        // Fill the chunk buffer
        // Work backwards, filling from the end of the buffer towards the front.
        //
        while (destIx>2 && (srcIx - toUCharsMapStart > 5) && (srcIx > 0)) {
            srcIx--;
            destIx--;

            // Get last byte of the UTF-8 character
            c = s8[srcIx];
            if (c<0x80) {
                // Special case ASCII range for speed.
                buf[destIx] = (UChar)c;
                U_ASSERT(toUCharsMapStart <= srcIx);
                mapToUChars[srcIx - toUCharsMapStart] = (uint8_t)destIx;
                mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
            } else {
                // General case, handle everything non-ASCII.

                int32_t  sIx      = srcIx;  // ix of last byte of multi-byte u8 char

                // Get the full character from the UTF8 string.
                //   use code derived from tbe macros in utf8.h
                //   Leaves srcIx pointing at the first byte of the UTF-8 char.
                //
                c=utf8_prevCharSafeBody(s8, 0, &srcIx, c, -3);
                // leaves srcIx at first byte of the multi-byte char.

                // Store the character in UTF-16 buffer.
                if (c<0x10000) {
                    buf[destIx] = (UChar)c;
                    mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
                } else {
                    buf[destIx]         = U16_TRAIL(c);
                    mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
                    buf[--destIx]       = U16_LEAD(c);
                    mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
                }

                // Fill in the map from native indexes to UChars buf index.
                do {
                    mapToUChars[sIx-- - toUCharsMapStart] = (uint8_t)destIx;
                } while (sIx >= srcIx);
                U_ASSERT(toUCharsMapStart <= (srcIx+1));

                // Set native indexing limit to be the current position.
                //   We are processing a non-ascii, non-native-indexing char now;
                //     the limit will be here if the rest of the chars to be
                //     added to this buffer are ascii.
                bufNILimit = destIx;
            }
        }
        u8b_swap->bufNativeStart     = srcIx;
        u8b_swap->bufNativeLimit     = ix;
        u8b_swap->bufStartIdx        = destIx;
        u8b_swap->bufLimitIdx        = UTF8_TEXT_CHUNK_SIZE+2;
        u8b_swap->bufNILimit         = bufNILimit - u8b_swap->bufStartIdx;
        u8b_swap->toUCharsMapStart   = toUCharsMapStart;

        ut->chunkContents       = &buf[u8b_swap->bufStartIdx];
        ut->chunkLength         = u8b_swap->bufLimitIdx - u8b_swap->bufStartIdx;
        ut->chunkOffset         = ut->chunkLength;
        ut->chunkNativeStart    = u8b_swap->bufNativeStart;
        ut->chunkNativeLimit    = u8b_swap->bufNativeLimit;
        ut->nativeIndexingLimit = u8b_swap->bufNILimit;
        return TRUE;
    }

}